

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_context.cpp
# Opt level: O2

void __thiscall
duckdb::BindContext::AddGenericBinding
          (BindContext *this,idx_t index,string *alias,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names,vector<duckdb::LogicalType,_true> *types)

{
  pointer *__ptr;
  _Head_base<0UL,_duckdb::Binding_*,_false> local_b8;
  BindingType local_ac;
  idx_t local_a8;
  string local_a0;
  BindingAlias local_80;
  
  local_ac = BASE;
  local_a8 = index;
  ::std::__cxx11::string::string((string *)&local_a0,(string *)alias);
  BindingAlias::BindingAlias(&local_80,&local_a0);
  make_uniq<duckdb::Binding,duckdb::BindingType,duckdb::BindingAlias,duckdb::vector<duckdb::LogicalType,true>const&,duckdb::vector<std::__cxx11::string,true>const&,unsigned_long&>
            ((duckdb *)&local_b8,&local_ac,&local_80,types,names,&local_a8);
  ::std::
  vector<duckdb::unique_ptr<duckdb::Binding,std::default_delete<duckdb::Binding>,true>,std::allocator<duckdb::unique_ptr<duckdb::Binding,std::default_delete<duckdb::Binding>,true>>>
  ::emplace_back<duckdb::unique_ptr<duckdb::Binding,std::default_delete<duckdb::Binding>,true>>
            ((vector<duckdb::unique_ptr<duckdb::Binding,std::default_delete<duckdb::Binding>,true>,std::allocator<duckdb::unique_ptr<duckdb::Binding,std::default_delete<duckdb::Binding>,true>>>
              *)&this->bindings_list,
             (unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true> *)&local_b8);
  if (local_b8._M_head_impl != (Binding *)0x0) {
    (*(local_b8._M_head_impl)->_vptr_Binding[1])();
  }
  local_b8._M_head_impl = (Binding *)0x0;
  BindingAlias::~BindingAlias(&local_80);
  ::std::__cxx11::string::~string((string *)&local_a0);
  return;
}

Assistant:

void BindContext::AddGenericBinding(idx_t index, const string &alias, const vector<string> &names,
                                    const vector<LogicalType> &types) {
	AddBinding(make_uniq<Binding>(BindingType::BASE, BindingAlias(alias), types, names, index));
}